

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::AddMaximalReconvergence(ModifyMaximalReconvergence *this)

{
  IRContext *pIVar1;
  Module *pMVar2;
  int iVar3;
  uint32_t uVar4;
  size_type sVar5;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  Instruction *pIVar6;
  uint uVar7;
  long lVar8;
  ModifyMaximalReconvergence *pMVar9;
  Instruction *pIVar10;
  undefined8 uVar11;
  bool bVar12;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar13;
  uint32_t id;
  Instruction extension;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_points_with_mode;
  bool local_1d5;
  array<signed_char,_4UL> local_1d4;
  ModifyMaximalReconvergence *local_1d0;
  Instruction *local_1c8;
  int local_1bc [3];
  undefined8 local_1b0;
  undefined1 local_1a8 [24];
  undefined1 local_190 [8];
  undefined1 *local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined1 local_170 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_150;
  undefined1 local_148 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_128;
  Instruction *local_120;
  undefined1 local_118 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_f8;
  IRContext *local_f0;
  Instruction local_e8;
  initializer_list<spvtools::opt::Operand> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
  }
  local_1d5 = EnumSet<spv::Capability>::contains
                        (&((pIVar1->feature_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>.
                          _M_head_impl)->capabilities_,CapabilityShader);
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar6 = *(Instruction **)
            ((long)&(pMVar2->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar10 = (Instruction *)
            ((long)&(pMVar2->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_1d0 = this;
  if (pIVar6 == pIVar10) {
    bVar12 = false;
  }
  else {
    do {
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_00948898;
      local_e8.unique_id_ = pIVar6->unique_id_;
      local_e8.context_ = pIVar6->context_;
      local_e8.opcode_ = pIVar6->opcode_;
      local_e8.has_type_id_ = pIVar6->has_type_id_;
      local_e8.has_result_id_ = pIVar6->has_result_id_;
      local_e8._46_2_ = *(undefined2 *)&pIVar6->field_0x2e;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8.operands_,&pIVar6->operands_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
                (&local_e8.dbg_line_insts_,&pIVar6->dbg_line_insts_);
      local_e8.dbg_scope_ = pIVar6->dbg_scope_;
      if (local_e8.operands_.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_e8.operands_.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
      }
      Operand::AsString_abi_cxx11_
                ((string *)local_1a8,
                 local_e8.operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar3 = std::__cxx11::string::compare((char *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      Instruction::~Instruction(&local_e8);
      bVar12 = false;
      if (iVar3 == 0) {
        bVar12 = true;
        break;
      }
      pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar6 != pIVar10);
  }
  local_68._M_allocated_capacity = (size_type)&uStack_38;
  local_68._8_8_ = 1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  pMVar2 = (((local_1d0->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar6 = *(Instruction **)
            ((long)&(pMVar2->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  pIVar10 = (Instruction *)
            ((long)&(pMVar2->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (pIVar6 != pIVar10) {
    do {
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_00948898;
      local_e8.unique_id_ = pIVar6->unique_id_;
      local_e8.context_ = pIVar6->context_;
      local_e8.opcode_ = pIVar6->opcode_;
      local_e8.has_type_id_ = pIVar6->has_type_id_;
      local_e8.has_result_id_ = pIVar6->has_result_id_;
      local_e8._46_2_ = *(undefined2 *)&pIVar6->field_0x2e;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8.operands_,&pIVar6->operands_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
                (&local_e8.dbg_line_insts_,&pIVar6->dbg_line_insts_);
      local_e8.dbg_scope_ = pIVar6->dbg_scope_;
      uVar7 = (local_e8.has_result_id_ & 1) + 1;
      if (local_e8.has_type_id_ == false) {
        uVar7 = (uint)local_e8.has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(&local_e8,uVar7 + 1);
      if (uVar4 == 0x1787) {
        uVar4 = (local_e8.has_result_id_ & 1) + 1;
        if (local_e8.has_type_id_ == false) {
          uVar4 = (uint)local_e8.has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(&local_e8,uVar4);
        local_148._0_4_ = uVar4;
        local_1a8._0_8_ = &local_68;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,local_148,local_1a8);
      }
      Instruction::~Instruction(&local_e8);
      pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar6 != pIVar10);
  }
  pMVar2 = (((local_1d0->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar6 = *(Instruction **)
            ((long)&(pMVar2->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_120 = (Instruction *)
              ((long)&(pMVar2->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  uVar11 = 0;
  if (pIVar6 != local_120) {
    local_1b0 = 0;
    pMVar9 = local_1d0;
    do {
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
      local_e8.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_00948898;
      local_e8.unique_id_ = pIVar6->unique_id_;
      local_e8.context_ = pIVar6->context_;
      local_e8.opcode_ = pIVar6->opcode_;
      local_e8.has_type_id_ = pIVar6->has_type_id_;
      local_e8.has_result_id_ = pIVar6->has_result_id_;
      local_e8._46_2_ = *(undefined2 *)&pIVar6->field_0x2e;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_e8.operands_,&pIVar6->operands_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
                (&local_e8.dbg_line_insts_,&pIVar6->dbg_line_insts_);
      local_e8.dbg_scope_ = pIVar6->dbg_scope_;
      uVar7 = (local_e8.has_result_id_ & 1) + 1;
      if (local_e8.has_type_id_ == false) {
        uVar7 = (uint)local_e8.has_result_id_;
      }
      local_1d4._M_elems = (_Type)Instruction::GetSingleWordOperand(&local_e8,uVar7 + 1);
      sVar5 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&local_68,(key_type *)&local_1d4);
      if (sVar5 == 0) {
        if (!bVar12) {
          pIVar1 = (pMVar9->super_Pass).context_;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1a8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"SPV_KHR_maximal_reconvergence","");
          IRContext::AddExtension(pIVar1,(string *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          bVar12 = true;
          pMVar9 = local_1d0;
        }
        if (local_1d5 == false) {
          IRContext::AddCapability((pMVar9->super_Pass).context_,CapabilityShader);
          local_1d5 = true;
        }
        pIVar1 = (pMVar9->super_Pass).context_;
        local_1bc[2] = 0x10;
        local_1bc[1] = 0;
        local_1bc[0] = 0;
        local_148._0_8_ = &PTR__SmallVector_009488e0;
        local_148._24_8_ = local_148 + 0x10;
        local_128._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_148[0x10] = local_1d4._M_elems[0];
        local_148[0x11] = local_1d4._M_elems[1];
        local_148[0x12] = local_1d4._M_elems[2];
        local_148[0x13] = local_1d4._M_elems[3];
        local_148._8_8_ = 1;
        local_1a8._0_4_ = 1;
        local_1a8._8_8_ = &PTR__SmallVector_009488e0;
        local_1a8._16_8_ = 0;
        local_188 = local_190;
        local_180 = 0;
        local_f0 = pIVar1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_1a8 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_148);
        local_118._0_8_ = &PTR__SmallVector_009488e0;
        local_118._24_8_ = local_118 + 0x10;
        local_f8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_118[0x10] = -0x79;
        local_118[0x11] = '\x17';
        local_118[0x12] = '\0';
        local_118[0x13] = '\0';
        local_118._8_8_ = 1;
        local_178 = 0x10;
        local_170._0_8_ = &PTR__SmallVector_009488e0;
        local_170._8_8_ = 0;
        local_170._24_8_ = local_170 + 0x10;
        local_150._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)local_170,
                   (SmallVector<unsigned_int,_2UL> *)local_118);
        local_78._M_array = (iterator)local_1a8;
        local_78._M_len = 2;
        MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                  ((spvtools *)&local_1c8,&local_f0,(Op *)(local_1bc + 2),local_1bc + 1,local_1bc,
                   &local_78);
        pIVar10 = local_1c8;
        local_1c8 = (Instruction *)0x0;
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                    execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar10);
        if (local_1c8 != (Instruction *)0x0) {
          (**(code **)(*(long *)local_1c8 + 8))();
        }
        local_1c8 = (Instruction *)0x0;
        lVar8 = -0x60;
        this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  &local_150;
        do {
          *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_009488e0;
          if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()(this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
          }
          *(undefined8 *)this_00 = 0;
          this_00 = this_00 + -0x30;
          lVar8 = lVar8 + 0x30;
        } while (lVar8 != 0);
        local_118._0_8_ = &PTR__SmallVector_009488e0;
        if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
            local_f8._M_head_impl !=
            (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_f8,local_f8._M_head_impl);
        }
        pMVar9 = local_1d0;
        local_148._0_8_ = &PTR__SmallVector_009488e0;
        if (local_128._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_128,local_128._M_head_impl);
        }
        local_1a8._0_8_ = &local_68;
        pVar13 = std::
                 _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 ::
                 _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                           ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)local_1a8._0_8_,&local_1d4,local_1a8);
        local_1b0 = CONCAT71(pVar13.first.super__Node_iterator_base<unsigned_int,_false>._M_cur.
                             _1_7_,1);
      }
      Instruction::~Instruction(&local_e8);
      pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      uVar11 = local_1b0;
    } while (pIVar6 != local_120);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_68);
  return (bool)((byte)uVar11 & 1);
}

Assistant:

bool ModifyMaximalReconvergence::AddMaximalReconvergence() {
  bool changed = false;
  bool has_extension = false;
  bool has_shader =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  for (auto extension : context()->extensions()) {
    if (extension.GetOperand(0).AsString() == "SPV_KHR_maximal_reconvergence") {
      has_extension = true;
      break;
    }
  }

  std::unordered_set<uint32_t> entry_points_with_mode;
  for (auto mode : get_module()->execution_modes()) {
    if (spv::ExecutionMode(mode.GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      entry_points_with_mode.insert(mode.GetSingleWordInOperand(0));
    }
  }

  for (auto entry_point : get_module()->entry_points()) {
    const uint32_t id = entry_point.GetSingleWordInOperand(1);
    if (!entry_points_with_mode.count(id)) {
      changed = true;
      if (!has_extension) {
        context()->AddExtension("SPV_KHR_maximal_reconvergence");
        has_extension = true;
      }
      if (!has_shader) {
        context()->AddCapability(spv::Capability::Shader);
        has_shader = true;
      }
      context()->AddExecutionMode(MakeUnique<Instruction>(
          context(), spv::Op::OpExecutionMode, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {id}},
              {SPV_OPERAND_TYPE_EXECUTION_MODE,
               {static_cast<uint32_t>(
                   spv::ExecutionMode::MaximallyReconvergesKHR)}}}));
      entry_points_with_mode.insert(id);
    }
  }

  return changed;
}